

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

map_index_t __thiscall
google::protobuf::internal::
KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
BucketNumber(KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *this,ViewType k)

{
  uint n;
  KeyNode *node;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  map_index_t mVar6;
  map_index_t extraout_EAX;
  map_index_t extraout_EAX_00;
  map_index_t extraout_EAX_01;
  map_index_t extraout_EAX_02;
  MixingHashState MVar7;
  TableEntryPtr *pTVar8;
  TableEntryPtr *pTVar9;
  pointer __s;
  string *psVar10;
  string *extraout_RAX;
  Arena *first;
  NodeBase *node_00;
  uint uVar11;
  size_t size;
  Arena *pAVar12;
  UntypedMapBase *this_00;
  UntypedMapBase *this_01;
  unsigned_long *puVar14;
  UntypedMapBase *this_02;
  ulong uVar15;
  uchar *bytes;
  uint64_t v;
  VariantKey key;
  ViewType k_00;
  ViewType k_01;
  NodeAndBucket NVar16;
  UntypedMapBase UStack_d0;
  undefined8 uStack_b0;
  unsigned_long auStack_a8 [2];
  UntypedMapBase *pUStack_98;
  ulong uStack_90;
  undefined8 uStack_88;
  UntypedMapBase UStack_60;
  size_t sStack_40;
  string *psVar13;
  
  first = (Arena *)k._M_str;
  size = k._M_len;
  this_00 = (UntypedMapBase *)&stack0xffffffffffffffc8;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)&absl::lts_20240722::hash_internal::MixingHashState::kSeed +
                 (ulong)(this->super_UntypedMapBase).seed_;
  sStack_40 = 0x1bc65d;
  MVar7 = absl::lts_20240722::hash_internal::MixingHashState::combine_contiguous
                    ((MixingHashState)
                     (SUB168(auVar1 * ZEXT816(0x9ddfea08eb382d69),8) ^
                     SUB168(auVar1 * ZEXT816(0x9ddfea08eb382d69),0)),(uchar *)first,size);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = MVar7.state_ + size;
  uVar11 = (this->super_UntypedMapBase).num_buckets_ - 1 &
           (SUB164(auVar2 * ZEXT816(0x9ddfea08eb382d69),8) ^
           SUB164(auVar2 * ZEXT816(0x9ddfea08eb382d69),0));
  pAVar12 = (Arena *)0x35190f;
  if (first != (Arena *)0x0) {
    pAVar12 = first;
  }
  sStack_40 = 0x1bc685;
  key.integral = size;
  key.data = (char *)pAVar12;
  mVar6 = UntypedMapBase::VariantBucketNumber(&this->super_UntypedMapBase,key);
  if (uVar11 == mVar6) {
    psVar10 = (string *)0x0;
  }
  else {
    sStack_40 = 0x1bc6da;
    psVar10 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                        ((ulong)uVar11,(ulong)mVar6,
                         "VariantBucketNumber(RealKeyToVariantKeyAlternative<Key>{}(k)) == VariantBucketNumber(RealKeyToVariantKey<Key>{}(k))"
                        );
  }
  if (psVar10 == (string *)0x0) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)&absl::lts_20240722::hash_internal::MixingHashState::kSeed +
                   (ulong)(this->super_UntypedMapBase).seed_;
    sStack_40 = 0x1bc6ae;
    MVar7 = absl::lts_20240722::hash_internal::MixingHashState::combine_contiguous
                      ((MixingHashState)
                       (SUB168(auVar3 * ZEXT816(0x9ddfea08eb382d69),8) ^
                       SUB168(auVar3 * ZEXT816(0x9ddfea08eb382d69),0)),(uchar *)first,size);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = MVar7.state_ + size;
    return (SUB164(auVar4 * ZEXT816(0x9ddfea08eb382d69),0) ^
           SUB164(auVar4 * ZEXT816(0x9ddfea08eb382d69),8)) &
           (this->super_UntypedMapBase).num_buckets_ - 1;
  }
  sStack_40 = 0x1bc6e7;
  KeyMapBase<std::__cxx11::string>::BucketNumber();
  this_01 = &UStack_60;
  uVar15 = (ulong)psVar10 & 0xffffffff;
  UStack_60.table_ = (TableEntryPtr *)this;
  UStack_60.alloc_.arena_ = first;
  sStack_40 = size;
  if ((this_00->index_of_first_non_null_ == this_00->num_buckets_) ||
     (psVar13 = psVar10, this_00->table_[this_00->index_of_first_non_null_] != 0)) {
    psVar13 = (string *)node_00[2].next;
    k_00._M_str = (char *)node_00[1].next;
    k_00._M_len = (size_t)psVar13;
    NVar16 = FindHelper((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)this_00,k_00,(TreeIterator *)0x0);
    if (NVar16.node == (NodeBase *)0x0) {
      mVar6 = (map_index_t)psVar10;
      if (this_00->table_[uVar15] == 0) {
        UntypedMapBase::InsertUniqueInList(this_00,mVar6,node_00);
        uVar11 = this_00->index_of_first_non_null_;
        if (uVar11 < mVar6) {
          mVar6 = uVar11;
        }
        this_00->index_of_first_non_null_ = mVar6;
        return uVar11;
      }
      if (((this_00->table_[uVar15] & 1) == 0) &&
         (bVar5 = UntypedMapBase::TableEntryIsTooLong(this_00,mVar6), !bVar5)) {
        UntypedMapBase::InsertUniqueInList(this_00,mVar6,node_00);
        return extraout_EAX_00;
      }
      UntypedMapBase::InsertUniqueInTree(this_00,mVar6,NodeToVariantKey,node_00);
      return extraout_EAX;
    }
    KeyMapBase<std::__cxx11::string>::InsertUnique(&UStack_60);
  }
  KeyMapBase<std::__cxx11::string>::InsertUnique(&UStack_60);
  uStack_88 = 0x9ddfea08eb382d69;
  puVar14 = auStack_a8;
  uStack_90 = uVar15;
  if (this_01->num_buckets_ == 1) {
    this_01->index_of_first_non_null_ = 2;
    this_01->num_buckets_ = 2;
    pAVar12 = (this_01->alloc_).arena_;
    if (pAVar12 == (Arena *)0x0) {
      uStack_b0 = 0x1bc7f1;
      pTVar8 = (TableEntryPtr *)operator_new(0x10);
    }
    else {
      uStack_b0 = 0x1bc7e5;
      pTVar8 = (TableEntryPtr *)Arena::AllocateForArray(pAVar12,0x10);
    }
    *pTVar8 = 0;
    pTVar8[1] = 0;
    this_01->table_ = pTVar8;
    auStack_a8[0] = rdtsc();
    uStack_b0 = 0x1bc82e;
    pUStack_98 = this_01;
    MVar7 = absl::lts_20240722::hash_internal::
            HashStateBase<absl::lts_20240722::hash_internal::MixingHashState>::
            combine<unsigned_long,google::protobuf::internal::TableEntryPtr*,void_const*>
                      ((MixingHashState)&absl::lts_20240722::hash_internal::MixingHashState::kSeed,
                       auStack_a8,&this_01->table_,&pUStack_98);
    this_01->seed_ = (map_index_t)MVar7.state_;
    return (map_index_t)MVar7.state_;
  }
  uVar11 = (uint)psVar13;
  if (uVar11 < 2) {
    uStack_b0 = 0x1bc8ed;
    psVar10 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                        ((ulong)psVar13 & 0xffffffff,2,"new_num_buckets >= kMinTableSize");
  }
  else {
    psVar10 = (string *)0x0;
  }
  if (psVar10 != (string *)0x0) {
    uStack_b0 = 0x1bc8fd;
    KeyMapBase<std::__cxx11::string>::Resize();
    this_02 = &UStack_d0;
    uVar11 = (uint)psVar10;
    uVar15 = (ulong)psVar10 & 0xffffffff;
    UStack_d0.table_ = (TableEntryPtr *)this_01;
    UStack_d0.alloc_.arena_ = (Arena *)this_00;
    if (uVar11 < 2) {
      psVar10 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                          (uVar15,2,"n >= kMinTableSize");
    }
    else {
      psVar10 = (string *)0x0;
    }
    if (psVar10 == (string *)0x0) {
      uVar11 = uVar11 - 1 & uVar11;
      if (uVar11 == 0) {
        psVar10 = (string *)0x0;
      }
      else {
        psVar10 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                            ((ulong)uVar11,0,"n & (n - 1) == 0u");
      }
      if (psVar10 == (string *)0x0) {
        UStack_d0._0_8_ = *(undefined8 *)((long)puVar14 + 0x18);
        __s = MapAllocator<google::protobuf::internal::TableEntryPtr>::allocate
                        ((MapAllocator<google::protobuf::internal::TableEntryPtr> *)&UStack_d0,
                         uVar15,(void *)0x0);
        memset(__s,0,uVar15 << 3);
        return (map_index_t)__s;
      }
    }
    else {
      UntypedMapBase::CreateEmptyTable();
      psVar10 = extraout_RAX;
    }
    UntypedMapBase::CreateEmptyTable();
    do {
      psVar13 = *(string **)psVar10;
      k_01._M_str = *(char **)(psVar10 + 8);
      k_01._M_len = *(size_t *)(psVar10 + 0x10);
      mVar6 = BucketNumber((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)this_02,k_01);
      InsertUnique((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)this_02,mVar6,(KeyNode *)psVar10);
      psVar10 = psVar13;
    } while (psVar13 != (string *)0x0);
    return extraout_EAX_02;
  }
  pTVar8 = this_01->table_;
  n = this_01->num_buckets_;
  this_01->num_buckets_ = uVar11;
  uStack_b0 = 0x1bc86b;
  pTVar9 = UntypedMapBase::CreateEmptyTable(this_01,uVar11);
  this_01->table_ = pTVar9;
  uVar11 = this_01->index_of_first_non_null_;
  uVar15 = (ulong)uVar11;
  this_01->index_of_first_non_null_ = this_01->num_buckets_;
  if (uVar11 < n) {
    do {
      node = (KeyNode *)pTVar8[uVar15];
      if (((ulong)node & 1) == 0 && node != (KeyNode *)0x0) {
        uStack_b0 = 0x1bc8a0;
        TransferList((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this_01,node);
      }
      else if (((ulong)node & 1) != 0) {
        uStack_b0 = 0x1bc8b6;
        UntypedMapBase::TransferTree
                  (this_01,(Tree *)((long)&node[-1].super_NodeBase.next + 7),NodeToVariantKey);
      }
      uVar15 = uVar15 + 1;
    } while (n != uVar15);
  }
  UntypedMapBase::DeleteTable(this_01,pTVar8,n);
  return extraout_EAX_01;
}

Assistant:

map_index_t BucketNumber(typename TS::ViewType k) const {
    ABSL_DCHECK_EQ(
        VariantBucketNumber(RealKeyToVariantKeyAlternative<Key>{}(k)),
        VariantBucketNumber(RealKeyToVariantKey<Key>{}(k)));
    return VariantBucketNumber(RealKeyToVariantKeyAlternative<Key>{}(k));
  }